

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::LayerNormalizationLayerParams::InternalSwap
          (LayerNormalizationLayerParams *this,LayerNormalizationLayerParams *other)

{
  float fVar1;
  int iVar2;
  WeightParams *pWVar3;
  
  google::protobuf::RepeatedField<long>::InternalSwap
            (&this->normalizedshape_,&other->normalizedshape_);
  pWVar3 = this->gamma_;
  this->gamma_ = other->gamma_;
  other->gamma_ = pWVar3;
  pWVar3 = this->beta_;
  this->beta_ = other->beta_;
  other->beta_ = pWVar3;
  fVar1 = this->eps_;
  this->eps_ = other->eps_;
  other->eps_ = fVar1;
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void LayerNormalizationLayerParams::InternalSwap(LayerNormalizationLayerParams* other) {
  normalizedshape_.InternalSwap(&other->normalizedshape_);
  std::swap(gamma_, other->gamma_);
  std::swap(beta_, other->beta_);
  std::swap(eps_, other->eps_);
  std::swap(_cached_size_, other->_cached_size_);
}